

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

InlineRep * __thiscall
absl::lts_20250127::Cord::InlineRep::operator=(InlineRep *this,InlineRep *src)

{
  CordRep *pCVar1;
  
  if (this != src) {
    if ((((this->data_).rep_.field_0.data[0] & 1U) == 0) &&
       (((src->data_).rep_.field_0.data[0] & 1U) == 0)) {
      pCVar1 = (src->data_).rep_.field_0.as_tree.rep;
      (this->data_).rep_.field_0.as_tree.cordz_info = (src->data_).rep_.field_0.as_tree.cordz_info;
      (this->data_).rep_.field_0.as_tree.rep = pCVar1;
    }
    else {
      AssignSlow(this,src);
    }
  }
  return this;
}

Assistant:

inline Cord::InlineRep& Cord::InlineRep::operator=(const Cord::InlineRep& src) {
  if (this == &src) {
    return *this;
  }
  if (!is_tree() && !src.is_tree()) {
    data_ = src.data_;
    return *this;
  }
  AssignSlow(src);
  return *this;
}